

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeKineticCorrFunc.cpp
# Opt level: O2

int __thiscall
OpenMD::ChargeKineticCorrFunc::computeProperty2
          (ChargeKineticCorrFunc *this,int frame,StuntDouble *sd)

{
  pointer pvVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Vector3d angMom;
  Mat3x3d I;
  Vector3d vel;
  RectMatrix<double,_3U,_3U> local_68;
  
  StuntDouble::getPos((Vector3d *)&I,sd);
  Vector<double,_3U>::operator=(&(this->pos2_).super_Vector<double,_3U>,(Vector<double,_3U> *)&I);
  dVar5 = sd->mass_;
  StuntDouble::getVel(&vel,sd);
  dVar5 = (vel.super_Vector<double,_3U>.data_[2] * vel.super_Vector<double,_3U>.data_[2] +
          vel.super_Vector<double,_3U>.data_[0] * vel.super_Vector<double,_3U>.data_[0] +
          vel.super_Vector<double,_3U>.data_[1] * vel.super_Vector<double,_3U>.data_[1]) * dVar5 +
          0.0;
  Vector<double,_3U>::Vector(&angMom.super_Vector<double,_3U>);
  SquareMatrix<double,_3>::SquareMatrix(&I.super_SquareMatrix<double,_3>);
  if (sd->objType_ - otDAtom < 2) {
    StuntDouble::getJ((Vector3d *)&local_68,sd);
    Vector<double,_3U>::operator=(&angMom.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_68);
    (*sd->_vptr_StuntDouble[5])(&local_68,sd);
    RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)&I,&local_68);
    if (sd->linear_ == true) {
      uVar4 = (long)(sd->linearAxis_ + 1) % 3 & 0xffffffff;
      uVar3 = (long)(sd->linearAxis_ + 2) % 3 & 0xffffffff;
      dVar7 = angMom.super_Vector<double,_3U>.data_[uVar4];
      dVar6 = (dVar7 * dVar7) /
              *(double *)
               ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
               uVar4 * 0x20);
      dVar7 = angMom.super_Vector<double,_3U>.data_[uVar3];
      dVar7 = dVar7 * dVar7;
      pdVar2 = (double *)
               ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
               uVar3 * 0x20);
    }
    else {
      pdVar2 = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2] + 2;
      auVar8._0_8_ = angMom.super_Vector<double,_3U>.data_[0] *
                     angMom.super_Vector<double,_3U>.data_[0];
      auVar8._8_8_ = angMom.super_Vector<double,_3U>.data_[1] *
                     angMom.super_Vector<double,_3U>.data_[1];
      auVar9._8_8_ = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
      auVar9._0_8_ = I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
      auVar9 = divpd(auVar8,auVar9);
      dVar6 = auVar9._8_8_ + auVar9._0_8_;
      dVar7 = angMom.super_Vector<double,_3U>.data_[2] * angMom.super_Vector<double,_3U>.data_[2];
    }
    dVar5 = dVar5 + dVar7 / *pdVar2 + dVar6;
  }
  this->propertyTemp = dVar5 * 0.5;
  std::vector<double,_std::allocator<double>_>::push_back
            ((this->kinetic_).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + frame,&this->propertyTemp);
  this->sumKinetic_ = this->propertyTemp + this->sumKinetic_;
  this->kineticCount_ = this->kineticCount_ + 1;
  pvVar1 = (this->kinetic_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return (int)((ulong)((long)pvVar1[frame].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      *(long *)&pvVar1[frame].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data) >> 3) + -1;
}

Assistant:

int ChargeKineticCorrFunc::computeProperty2(int frame, StuntDouble* sd) {
    RealType kinetic(0.0);
    pos2_ = sd->getPos();

    RealType mass = sd->getMass();
    Vector3d vel  = sd->getVel();

    kinetic += mass * (vel[0] * vel[0] + vel[1] * vel[1] + vel[2] * vel[2]);

    Vector3d angMom;
    Mat3x3d I;
    int i, j, k;

    if (sd->isDirectional()) {
      angMom = sd->getJ();
      I      = sd->getI();

      if (sd->isLinear()) {
        i = sd->linearAxis();
        j = (i + 1) % 3;
        k = (i + 2) % 3;
        kinetic +=
            angMom[j] * angMom[j] / I(j, j) + angMom[k] * angMom[k] / I(k, k);
      } else {
        kinetic += angMom[0] * angMom[0] / I(0, 0) +
                   angMom[1] * angMom[1] / I(1, 1) +
                   angMom[2] * angMom[2] / I(2, 2);
      }
    }
    propertyTemp = 0.5 * kinetic;
    kinetic_[frame].push_back(propertyTemp);
    sumKinetic_ += propertyTemp;
    kineticCount_++;
    return kinetic_[frame].size() - 1;
  }